

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

bool __thiscall
Catch::ListeningReporter::assertionEnded(ListeningReporter *this,AssertionStats *assertionStats)

{
  pointer puVar1;
  int iVar2;
  IStreamingReporter *pIVar3;
  undefined8 extraout_RDX;
  unique_ptr<Catch::IStreamingReporter> *listener;
  pointer this_00;
  
  puVar1 = (this->m_listeners).
           super__Vector_base<Catch::Detail::unique_ptr<Catch::IStreamingReporter>,_std::allocator<Catch::Detail::unique_ptr<Catch::IStreamingReporter>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (this_00 = (this->m_listeners).
                 super__Vector_base<Catch::Detail::unique_ptr<Catch::IStreamingReporter>,_std::allocator<Catch::Detail::unique_ptr<Catch::IStreamingReporter>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; this_00 != puVar1; this_00 = this_00 + 1
      ) {
    pIVar3 = Detail::unique_ptr<Catch::IStreamingReporter>::operator->(this_00);
    (*pIVar3->_vptr_IStreamingReporter[0xd])(pIVar3,assertionStats);
  }
  pIVar3 = Detail::unique_ptr<Catch::IStreamingReporter>::operator->(&this->m_reporter);
  iVar2 = (*pIVar3->_vptr_IStreamingReporter[0xd])
                    (pIVar3,assertionStats,extraout_RDX,pIVar3->_vptr_IStreamingReporter[0xd]);
  return SUB41(iVar2,0);
}

Assistant:

bool ListeningReporter::assertionEnded(AssertionStats const &assertionStats) {
        for (auto const &listener : m_listeners) {
            static_cast<void>(listener->assertionEnded(assertionStats));
        }
        return m_reporter->assertionEnded(assertionStats);
    }